

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O0

FT_ULong tt_face_get_location(TT_Face face,FT_UInt gindex,FT_UInt *asize)

{
  byte *pbVar1;
  FT_Byte *pFVar2;
  FT_Byte *p_limit;
  FT_Byte *p;
  FT_ULong pos2;
  FT_ULong pos1;
  FT_UInt *asize_local;
  FT_UInt gindex_local;
  TT_Face face_local;
  
  p = (FT_Byte *)0x0;
  pos2 = 0;
  if ((ulong)gindex < face->num_locations) {
    if ((face->header).Index_To_Loc_Format == 0) {
      pFVar2 = face->glyph_locations + (gindex << 1);
      p = (FT_Byte *)(ulong)CONCAT11(*pFVar2,pFVar2[1]);
      if (pFVar2 + 4 <= face->glyph_locations + face->num_locations * 2) {
        p = (FT_Byte *)(ulong)CONCAT11(pFVar2[2],pFVar2[3]);
      }
      pos2 = (long)(ulong)CONCAT11(*pFVar2,pFVar2[1]) << 1;
      p = (FT_Byte *)((long)p << 1);
    }
    else {
      pbVar1 = face->glyph_locations + (gindex << 2);
      pos2 = (FT_ULong)
             ((uint)*pbVar1 << 0x18 | (uint)pbVar1[1] << 0x10 | (uint)pbVar1[2] << 8 |
             (uint)pbVar1[3]);
      p = (FT_Byte *)pos2;
      if (pbVar1 + 8 <= face->glyph_locations + face->num_locations * 4) {
        p = (FT_Byte *)
            (ulong)((uint)pbVar1[4] << 0x18 | (uint)pbVar1[5] << 0x10 | (uint)pbVar1[6] << 8 |
                   (uint)pbVar1[7]);
      }
    }
  }
  if (face->glyf_len < pos2) {
    *asize = 0;
    face_local = (TT_Face)0x0;
  }
  else {
    if ((FT_Byte *)face->glyf_len < p) {
      if ((ulong)gindex != face->num_locations - 2) {
        *asize = 0;
        return 0;
      }
      p = (FT_Byte *)face->glyf_len;
    }
    if (p < pos2) {
      *asize = (int)face->glyf_len - (int)pos2;
    }
    else {
      *asize = (int)p - (int)pos2;
    }
    face_local = (TT_Face)pos2;
  }
  return (FT_ULong)face_local;
}

Assistant:

FT_LOCAL_DEF( FT_ULong )
  tt_face_get_location( TT_Face   face,
                        FT_UInt   gindex,
                        FT_UInt  *asize )
  {
    FT_ULong  pos1, pos2;
    FT_Byte*  p;
    FT_Byte*  p_limit;


    pos1 = pos2 = 0;

    if ( gindex < face->num_locations )
    {
      if ( face->header.Index_To_Loc_Format != 0 )
      {
        p       = face->glyph_locations + gindex * 4;
        p_limit = face->glyph_locations + face->num_locations * 4;

        pos1 = FT_NEXT_ULONG( p );
        pos2 = pos1;

        if ( p + 4 <= p_limit )
          pos2 = FT_NEXT_ULONG( p );
      }
      else
      {
        p       = face->glyph_locations + gindex * 2;
        p_limit = face->glyph_locations + face->num_locations * 2;

        pos1 = FT_NEXT_USHORT( p );
        pos2 = pos1;

        if ( p + 2 <= p_limit )
          pos2 = FT_NEXT_USHORT( p );

        pos1 <<= 1;
        pos2 <<= 1;
      }
    }

    /* Check broken location data. */
    if ( pos1 > face->glyf_len )
    {
      FT_TRACE1(( "tt_face_get_location:"
                  " too large offset (0x%08lx) found for glyph index %ld,\n"
                  "                     "
                  " exceeding the end of `glyf' table (0x%08lx)\n",
                  pos1, gindex, face->glyf_len ));
      *asize = 0;
      return 0;
    }

    if ( pos2 > face->glyf_len )
    {
      /* We try to sanitize the last `loca' entry. */
      if ( gindex == face->num_locations - 2 )
      {
        FT_TRACE1(( "tt_face_get_location:"
                    " too large size (%ld bytes) found for glyph index %ld,\n"
                    "                     "
                    " truncating at the end of `glyf' table to %ld bytes\n",
                    pos2 - pos1, gindex, face->glyf_len - pos1 ));
        pos2 = face->glyf_len;
      }
      else
      {
        FT_TRACE1(( "tt_face_get_location:"
                    " too large offset (0x%08lx) found for glyph index %ld,\n"
                    "                     "
                    " exceeding the end of `glyf' table (0x%08lx)\n",
                    pos2, gindex + 1, face->glyf_len ));
        *asize = 0;
        return 0;
      }
    }

    /* The `loca' table must be ordered; it refers to the length of */
    /* an entry as the difference between the current and the next  */
    /* position.  However, there do exist (malformed) fonts which   */
    /* don't obey this rule, so we are only able to provide an      */
    /* upper bound for the size.                                    */
    /*                                                              */
    /* We get (intentionally) a wrong, non-zero result in case the  */
    /* `glyf' table is missing.                                     */
    if ( pos2 >= pos1 )
      *asize = (FT_UInt)( pos2 - pos1 );
    else
      *asize = (FT_UInt)( face->glyf_len - pos1 );

    return pos1;
  }